

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNMatrix SUNSparseMatrix(sunindextype M,sunindextype N,sunindextype NNZ,int sparsetype,
                         SUNContext sunctx)

{
  sunindextype *psVar1;
  SUNMatrix_Ops p_Var2;
  sunindextype *psVar3;
  SUNMatrix A;
  sunindextype *psVar4;
  sunindextype *psVar5;
  void *pvVar6;
  sunindextype *psVar7;
  sunindextype *psVar8;
  bool bVar9;
  
  if ((((uint)sparsetype < 2 && -1 < NNZ) && (0 < N && 0 < M)) &&
     (A = SUNMatNewEmpty(sunctx), A != (SUNMatrix)0x0)) {
    p_Var2 = A->ops;
    p_Var2->getid = SUNMatGetID_Sparse;
    p_Var2->clone = SUNMatClone_Sparse;
    p_Var2->destroy = SUNMatDestroy_Sparse;
    p_Var2->zero = SUNMatZero_Sparse;
    p_Var2->copy = SUNMatCopy_Sparse;
    p_Var2->scaleadd = SUNMatScaleAdd_Sparse;
    p_Var2->scaleaddi = SUNMatScaleAddI_Sparse;
    p_Var2->matvec = SUNMatMatvec_Sparse;
    p_Var2->space = SUNMatSpace_Sparse;
    psVar4 = (sunindextype *)malloc(0x50);
    if (psVar4 != (sunindextype *)0x0) {
      A->content = psVar4;
      psVar4[6] = sparsetype;
      *psVar4 = M;
      psVar4[1] = N;
      bVar9 = (sparsetype & 1U) != 0;
      if (bVar9) {
        N = M;
      }
      psVar1 = psVar4 + 8;
      psVar7 = (sunindextype *)0x0;
      if (bVar9) {
        psVar7 = psVar1;
      }
      psVar8 = (sunindextype *)0x0;
      if (bVar9) {
        psVar8 = psVar4 + 10;
      }
      psVar4[2] = NNZ;
      psVar5 = psVar4 + 10;
      psVar3 = psVar1;
      if (bVar9) {
        psVar5 = (sunindextype *)0x0;
        psVar3 = (sunindextype *)0x0;
      }
      psVar4[3] = N;
      *(sunindextype **)(psVar4 + 0x10) = psVar7;
      *(sunindextype **)(psVar4 + 0x12) = psVar8;
      *(sunindextype **)(psVar4 + 0xc) = psVar3;
      *(sunindextype **)(psVar4 + 0xe) = psVar5;
      pvVar6 = calloc((ulong)(uint)NNZ,8);
      psVar4[8] = 0;
      psVar4[9] = 0;
      psVar4[10] = 0;
      psVar4[0xb] = 0;
      *(void **)(psVar4 + 4) = pvVar6;
      if (pvVar6 != (void *)0x0) {
        pvVar6 = calloc((ulong)(uint)NNZ,4);
        *(void **)psVar1 = pvVar6;
        if (pvVar6 != (void *)0x0) {
          pvVar6 = calloc((ulong)(N + 1),4);
          *(void **)(psVar4 + 10) = pvVar6;
          if (pvVar6 != (void *)0x0) {
            return A;
          }
        }
      }
    }
    SUNMatDestroy(A);
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseMatrix(sunindextype M, sunindextype N,
                          sunindextype NNZ, int sparsetype,
                          SUNContext sunctx)
{
  SUNMatrix A;
  SUNMatrixContent_Sparse content;

  /* return with NULL matrix on illegal input */
  if ( (M <= 0) || (N <= 0) || (NNZ < 0) ) return(NULL);
  if ( (sparsetype != CSC_MAT) && (sparsetype != CSR_MAT) ) return(NULL);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  if (A == NULL) return(NULL);

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Sparse;
  A->ops->clone     = SUNMatClone_Sparse;
  A->ops->destroy   = SUNMatDestroy_Sparse;
  A->ops->zero      = SUNMatZero_Sparse;
  A->ops->copy      = SUNMatCopy_Sparse;
  A->ops->scaleadd  = SUNMatScaleAdd_Sparse;
  A->ops->scaleaddi = SUNMatScaleAddI_Sparse;
  A->ops->matvec    = SUNMatMatvec_Sparse;
  A->ops->space     = SUNMatSpace_Sparse;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Sparse) malloc(sizeof *content);
  if (content == NULL) { SUNMatDestroy(A); return(NULL); }

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->sparsetype = sparsetype;
  content->M = M;
  content->N = N;
  content->NNZ = NNZ;
  switch(sparsetype){
  case CSC_MAT:
    content->NP = N;
    content->rowvals = &(content->indexvals);
    content->colptrs = &(content->indexptrs);
    /* CSR indices */
    content->colvals = NULL;
    content->rowptrs = NULL;
    break;
  case CSR_MAT:
    content->NP = M;
    content->colvals = &(content->indexvals);
    content->rowptrs = &(content->indexptrs);
    /* CSC indices */
    content->rowvals = NULL;
    content->colptrs = NULL;
  }
  content->data      = NULL;
  content->indexvals = NULL;
  content->indexptrs = NULL;

  /* Allocate content */
  content->data = (realtype *) calloc(NNZ, sizeof(realtype));
  if (content->data == NULL) { SUNMatDestroy(A); return(NULL); }

  content->indexvals = (sunindextype *) calloc(NNZ, sizeof(sunindextype));
  if (content->indexvals == NULL) { SUNMatDestroy(A); return(NULL); }

  content->indexptrs = (sunindextype *) calloc((content->NP + 1), sizeof(sunindextype));
  if (content->indexptrs == NULL) { SUNMatDestroy(A); return(NULL); }
  content->indexptrs[content->NP] = 0;

  return(A);
}